

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * mmap_probe(PRNGState *rs,size_t size)

{
  int iVar1;
  int *piVar2;
  void *__addr;
  uint64_t uVar3;
  uintptr_t addr;
  void *p;
  int retry;
  int olderr;
  size_t size_local;
  PRNGState *rs_local;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  p._0_4_ = 0;
  do {
    if (0x1d < (int)p) {
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      return (void *)0xffffffffffffffff;
    }
    __addr = mmap64((void *)mmap_probe::hint_addr,size,3,0x22,-1,0);
    if ((((ulong)__addr >> 0x2f == 0) && ((void *)0x3fff < __addr)) &&
       ((long)__addr + size >> 0x2f == 0)) {
      mmap_probe::hint_addr = (long)__addr + size;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      return __addr;
    }
    if (__addr == (void *)0xffffffffffffffff) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        return (void *)0xffffffffffffffff;
      }
    }
    else {
      munmap(__addr,size);
    }
    if (mmap_probe::hint_addr == 0) {
LAB_001a19f9:
      do {
        uVar3 = lj_prng_u64(rs);
        mmap_probe::hint_addr = uVar3 & 0x7ffffffff000;
      } while (mmap_probe::hint_addr < 0x4000);
    }
    else if ((int)p < 5) {
      mmap_probe::hint_addr = mmap_probe::hint_addr + 0x1000000;
      if (mmap_probe::hint_addr + size >> 0x2f != 0) {
        mmap_probe::hint_addr = 0;
      }
    }
    else {
      if ((int)p != 5) goto LAB_001a19f9;
      mmap_probe::hint_addr = 0;
    }
    p._0_4_ = (int)p + 1;
  } while( true );
}

Assistant:

static void *mmap_probe(PRNGState *rs, size_t size)
{
  /* Hint for next allocation. Doesn't need to be thread-safe. */
  static uintptr_t hint_addr = 0;
  int olderr = errno;
  int retry;
  for (retry = 0; retry < LJ_ALLOC_MMAP_PROBE_MAX; retry++) {
    void *p = mmap((void *)hint_addr, size, MMAP_PROT, MMAP_FLAGS_PROBE, -1, 0);
    uintptr_t addr = (uintptr_t)p;
    if ((addr >> LJ_ALLOC_MBITS) == 0 && addr >= LJ_ALLOC_MMAP_PROBE_LOWER &&
	((addr + size) >> LJ_ALLOC_MBITS) == 0) {
      /* We got a suitable address. Bump the hint address. */
      hint_addr = addr + size;
      errno = olderr;
      return p;
    }
    if (p != MFAIL) {
      munmap(p, size);
    } else if (errno == ENOMEM) {
      return MFAIL;
    }
    if (hint_addr) {
      /* First, try linear probing. */
      if (retry < LJ_ALLOC_MMAP_PROBE_LINEAR) {
	hint_addr += 0x1000000;
	if (((hint_addr + size) >> LJ_ALLOC_MBITS) != 0)
	  hint_addr = 0;
	continue;
      } else if (retry == LJ_ALLOC_MMAP_PROBE_LINEAR) {
	/* Next, try a no-hint probe to get back an ASLR address. */
	hint_addr = 0;
	continue;
      }
    }
    /* Finally, try pseudo-random probing. */
    do {
      hint_addr = lj_prng_u64(rs) & (((uintptr_t)1<<LJ_ALLOC_MBITS)-LJ_PAGESIZE);
    } while (hint_addr < LJ_ALLOC_MMAP_PROBE_LOWER);
  }
  errno = olderr;
  return MFAIL;
}